

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O3

aiNode * __thiscall Assimp::BVHLoader::ReadNode(BVHLoader *this)

{
  bool bVar1;
  int iVar2;
  aiNode *this_00;
  aiNode **__dest;
  void *__src;
  ulong __n;
  vector<aiNode_*,_std::allocator<aiNode_*>_> childNodes;
  string siteToken;
  string token;
  string openBrace;
  string nodeName;
  aiNode *child;
  void *local_268;
  iterator iStack_260;
  aiNode **local_258;
  string local_250;
  string local_230;
  string local_210;
  pointer local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  undefined1 auStack_198 [16];
  pointer pfStack_188;
  pointer local_180;
  pointer pfStack_178;
  
  GetNextToken_abi_cxx11_(&local_1e8,this);
  if (local_1e8._M_string_length != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_1e8);
    if (iVar2 != 0) {
      GetNextToken_abi_cxx11_(&local_210,this);
      iVar2 = std::__cxx11::string::compare((char *)&local_210);
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Expected opening brace \"{\", but found \"",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
        std::__cxx11::stringbuf::str();
        ThrowException(this,&local_250);
      }
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00,&local_1e8);
      local_268 = (void *)0x0;
      iStack_260._M_current = (aiNode **)0x0;
      local_258 = (aiNode **)0x0;
      local_1a8._8_8_ = (pointer)0x0;
      auStack_198._0_8_ = (pointer)0x0;
      auStack_198._8_8_ = (pointer)0x0;
      pfStack_188 = (pointer)0x0;
      local_180 = (pointer)0x0;
      pfStack_178 = (pointer)0x0;
      local_1a8._0_8_ = this_00;
      std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::
      emplace_back<Assimp::BVHLoader::Node>(&this->mNodes,(Node *)local_1a8);
      if (pfStack_188 != (pointer)0x0) {
        operator_delete(pfStack_188);
      }
      if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_1a8._8_8_);
      }
      local_1f0 = (this->mNodes).
                  super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      local_250._M_string_length = 0;
      local_250.field_2._M_local_buf[0] = '\0';
      do {
        GetNextToken_abi_cxx11_(&local_230,this);
        iVar2 = std::__cxx11::string::compare((char *)&local_230);
        if (iVar2 == 0) {
          bVar1 = true;
          ReadNodeOffset(this,this_00);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_230);
          if (iVar2 == 0) {
            bVar1 = true;
            ReadNodeChannels(this,local_1f0);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_230);
            if (iVar2 == 0) {
              local_1a8._0_8_ = ReadNode(this);
              ((aiNode *)local_1a8._0_8_)->mParent = this_00;
              if (iStack_260._M_current == local_258) {
                std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                          ((vector<aiNode*,std::allocator<aiNode*>> *)&local_268,iStack_260,
                           (aiNode **)local_1a8);
              }
              else {
LAB_003e2a25:
                *iStack_260._M_current = (aiNode *)local_1a8._0_8_;
                iStack_260._M_current = iStack_260._M_current + 1;
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_230);
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare((char *)&local_230);
                if (iVar2 != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Unknown keyword \"",0x11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_230._M_dataplus._M_p,
                             local_230._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
                  std::__cxx11::stringbuf::str();
                  ThrowException(this,&local_1c8);
                }
                bVar1 = false;
                goto LAB_003e2a31;
              }
              local_250._M_string_length = 0;
              *local_250._M_dataplus._M_p = '\0';
              GetNextToken_abi_cxx11_((string *)local_1a8,this);
              std::__cxx11::string::operator=((string *)&local_250,(string *)local_1a8);
              if ((aiNode *)local_1a8._0_8_ != (aiNode *)auStack_198) {
                operator_delete((void *)local_1a8._0_8_);
              }
              iVar2 = std::__cxx11::string::compare((char *)&local_250);
              if (iVar2 != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Expected \"End Site\" keyword, but found \"",0x28);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_230._M_dataplus._M_p,
                           local_230._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_250._M_dataplus._M_p,
                           local_250._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
                std::__cxx11::stringbuf::str();
                ThrowException(this,&local_1c8);
              }
              local_1a8._0_8_ = ReadEndSite(this,&local_1e8);
              ((aiNode *)local_1a8._0_8_)->mParent = this_00;
              if (iStack_260._M_current != local_258) goto LAB_003e2a25;
              std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                        ((vector<aiNode*,std::allocator<aiNode*>> *)&local_268,iStack_260,
                         (aiNode **)local_1a8);
            }
            bVar1 = true;
          }
        }
LAB_003e2a31:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        __src = local_268;
        if (!bVar1) {
          __n = (long)iStack_260._M_current - (long)local_268;
          if (__n != 0) {
            this_00->mNumChildren = (uint)(__n >> 3);
            __dest = (aiNode **)operator_new__(__n & 0x7fffffff8);
            this_00->mChildren = __dest;
            memmove(__dest,__src,__n);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
            __src = local_268;
          }
          if (__src != (void *)0x0) {
            operator_delete(__src);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p);
          }
          return this_00;
        }
      } while( true );
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Expected node name, but found \"",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_210);
}

Assistant:

aiNode* BVHLoader::ReadNode()
{
    // first token is name
    std::string nodeName = GetNextToken();
    if( nodeName.empty() || nodeName == "{")
        ThrowException( format() << "Expected node name, but found \"" << nodeName << "\"." );

    // then an opening brace should follow
    std::string openBrace = GetNextToken();
    if( openBrace != "{")
        ThrowException( format() << "Expected opening brace \"{\", but found \"" << openBrace << "\"." );

    // Create a node
    aiNode* node = new aiNode( nodeName);
    std::vector<aiNode*> childNodes;

    // and create an bone entry for it
    mNodes.push_back( Node( node));
    Node& internNode = mNodes.back();

    // now read the node's contents
    std::string siteToken;
    while( 1)
    {
        std::string token = GetNextToken();

        // node offset to parent node
        if( token == "OFFSET")
            ReadNodeOffset( node);
        else if( token == "CHANNELS")
            ReadNodeChannels( internNode);
        else if( token == "JOINT")
        {
            // child node follows
            aiNode* child = ReadNode();
            child->mParent = node;
            childNodes.push_back( child);
        }
        else if( token == "End")
        {
            // The real symbol is "End Site". Second part comes in a separate token
            siteToken.clear();
            siteToken = GetNextToken();
            if( siteToken != "Site")
                ThrowException( format() << "Expected \"End Site\" keyword, but found \"" << token << " " << siteToken << "\"." );

            aiNode* child = ReadEndSite( nodeName);
            child->mParent = node;
            childNodes.push_back( child);
        }
        else if( token == "}")
        {
            // we're done with that part of the hierarchy
            break;
        } else
        {
            // everything else is a parse error
            ThrowException( format() << "Unknown keyword \"" << token << "\"." );
        }
    }

    // add the child nodes if there are any
    if( childNodes.size() > 0)
    {
        node->mNumChildren = static_cast<unsigned int>(childNodes.size());
        node->mChildren = new aiNode*[node->mNumChildren];
        std::copy( childNodes.begin(), childNodes.end(), node->mChildren);
    }

    // and return the sub-hierarchy we built here
    return node;
}